

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O2

void __thiscall ParseInt32_Both_Test::TestBody(ParseInt32_Both_Test *this)

{
  anon_unknown.dwarf_90916::AssertInt32Equals(0,"0",Both);
  anon_unknown.dwarf_90916::AssertInt32Equals(1000,"1000",Both);
  anon_unknown.dwarf_90916::AssertInt32Equals(0x75bcd15,"123456789",Both);
  anon_unknown.dwarf_90916::AssertInt32Equals(0x7fffffff,"2147483647",Both);
  anon_unknown.dwarf_90916::AssertInt32Equals(0xffffffff,"4294967295",Both);
  anon_unknown.dwarf_90916::AssertInt32Equals(0xcafef00d,"0xcafef00d",Both);
  anon_unknown.dwarf_90916::AssertInt32Equals(0x7fffffff,"0x7fffffff",Both);
  anon_unknown.dwarf_90916::AssertInt32Equals(0x80000000,"0x80000000",Both);
  anon_unknown.dwarf_90916::AssertInt32Equals(0xffffffff,"0xffffffff",Both);
  return;
}

Assistant:

TEST(ParseInt32, Both) {
  AssertInt32Equals(0, "0");
  AssertInt32Equals(1000, "1000");
  AssertInt32Equals(123456789, "123456789");
  AssertInt32Equals(2147483647, "2147483647");
  AssertInt32Equals(4294967295u, "4294967295");
  AssertInt32Equals(0xcafef00du, "0xcafef00d");
  AssertInt32Equals(0x7fffffff, "0x7fffffff");
  AssertInt32Equals(0x80000000u, "0x80000000");
  AssertInt32Equals(0xffffffffu, "0xffffffff");
}